

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacketbuilder.cpp
# Opt level: O0

void __thiscall jrtplib::RTPPacketBuilder::Destroy(RTPPacketBuilder *this)

{
  uint8_t *buf;
  RTPMemoryManager *mgr;
  RTPPacketBuilder *this_local;
  
  if ((this->init & 1U) != 0) {
    buf = this->buffer;
    mgr = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    RTPDeleteByteArray(buf,mgr);
    this->init = false;
  }
  return;
}

Assistant:

void RTPPacketBuilder::Destroy()
{
	if (!init)
		return;
	RTPDeleteByteArray(buffer,GetMemoryManager());
	init = false;
}